

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O3

void insert_arg_range(rtosc_arg_val_t *arg,int32_t num,rtosc_arg_val_t *lhsarg,int has_delta,
                     rtosc_arg_val_t *delta,int lhs_overlap,int delta_less_is_endless)

{
  double dVar1;
  undefined7 uVar2;
  uint uVar3;
  int32_t iVar4;
  ulong uVar5;
  rtosc_arg_val_t *prVar6;
  size_t __n;
  rtosc_arg_val_t *prVar7;
  
  prVar7 = arg;
  if (has_delta != 0) {
    prVar7 = arg + 1;
    arg[1].val.b.data = (delta->val).b.data;
    uVar2 = *(undefined7 *)&delta->field_0x1;
    dVar1 = (delta->val).d;
    arg[1].type = delta->type;
    *(undefined7 *)&arg[1].field_0x1 = uVar2;
    arg[1].val.d = dVar1;
  }
  if (lhs_overlap == 0) {
    __n = 0x18;
    if (lhsarg->type == 'a') {
      iVar4 = rtosc_av_arr_len(lhsarg);
      __n = (long)iVar4 * 0x18 + 0x18;
    }
    memcpy(prVar7 + 1,lhsarg,__n);
  }
  else {
    if (lhsarg->type == 'a') {
      uVar3 = rtosc_av_arr_len(lhsarg);
      if (0 < (int)uVar3) {
        uVar5 = (ulong)uVar3 + 1;
        prVar6 = prVar7 + uVar3;
        do {
          prVar6[1].val.b.data = (prVar6->val).b.data;
          uVar2 = *(undefined7 *)&prVar6->field_0x1;
          dVar1 = (prVar6->val).d;
          prVar6[1].type = prVar6->type;
          *(undefined7 *)&prVar6[1].field_0x1 = uVar2;
          prVar6[1].val.d = dVar1;
          uVar5 = uVar5 - 1;
          prVar6 = prVar6 + -1;
        } while (1 < uVar5);
      }
    }
    prVar7[1].val.b.data = (lhsarg->val).b.data;
    uVar2 = *(undefined7 *)&lhsarg->field_0x1;
    dVar1 = (lhsarg->val).d;
    prVar7[1].type = lhsarg->type;
    *(undefined7 *)&prVar7[1].field_0x1 = uVar2;
    prVar7[1].val.d = dVar1;
  }
  iVar4 = 0;
  if (delta_less_is_endless == 0) {
    iVar4 = num;
  }
  arg->type = '-';
  if (has_delta != 0) {
    iVar4 = num;
  }
  rtosc_av_rep_num_set(arg,iVar4);
  rtosc_av_rep_has_delta_set(arg,has_delta);
  return;
}

Assistant:

static void insert_arg_range(rtosc_arg_val_t* arg, int32_t num,
                             const rtosc_arg_val_t* lhsarg,
                             int has_delta, const rtosc_arg_val_t* delta,
                             int lhs_overlap,
                             int delta_less_is_endless)
{
    rtosc_arg_val_t* first_arg = arg;
    if(has_delta)
        *++arg = *delta;
    if(lhs_overlap)
    {
        if(lhsarg->type == 'a')
        {
            // we inserted an 'a' element, so we need to
            // shift more than one element
            // the shifting amount is always one since array ranges
            // are delta-less
            // we have: '-'  a  a a a
            // =>       '-' 'a' a a a a
            for(int32_t i = rtosc_av_arr_len(lhsarg); i > 0; --i)
                arg[i+1] = arg[i];
        }
        *++arg = *lhsarg;
    }
    else
    {
        memcpy(++arg, lhsarg, incsize(lhsarg) * sizeof(rtosc_arg_val_t));
    }
    first_arg->type = '-';
    rtosc_av_rep_num_set(first_arg, (!has_delta && delta_less_is_endless) ? 0 : num);
    rtosc_av_rep_has_delta_set(first_arg, has_delta);
}